

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JITTimeProfileInfo.cpp
# Opt level: O3

LoopFlags __thiscall JITTimeProfileInfo::GetLoopFlags(JITTimeProfileInfo *this,uint loopNum)

{
  code *pcVar1;
  bool bVar2;
  LoopFlags LVar3;
  undefined4 *puVar4;
  BVFixedIDL *this_00;
  
  this_00 = (this->m_profileData).loopFlags;
  if (this_00 == (BVFixedIDL *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/JITTimeProfileInfo.cpp"
                       ,0x12a,"(GetLoopFlags() != nullptr)","GetLoopFlags() != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    this_00 = (this->m_profileData).loopFlags;
  }
  LVar3 = BVFixed::GetRange<Js::LoopFlags>((BVFixed *)this_00,loopNum * 2,2);
  return LVar3;
}

Assistant:

Js::LoopFlags
JITTimeProfileInfo::GetLoopFlags(uint loopNum) const
{
    Assert(GetLoopFlags() != nullptr);
    return GetLoopFlags()->GetRange<Js::LoopFlags>(loopNum * Js::LoopFlags::COUNT, Js::LoopFlags::COUNT);
}